

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O2

void __thiscall Dialog::on_mouse_button_up(Dialog *this,ALLEGRO_MOUSE_EVENT *event)

{
  Widget *pWVar1;
  int iVar2;
  
  if ((event->button == 1) && (pWVar1 = this->mouse_down_widget, pWVar1 != (Widget *)0x0)) {
    (*pWVar1->_vptr_Widget[8])(pWVar1,(ulong)(uint)event->x,(ulong)(uint)event->y);
    iVar2 = (*this->mouse_down_widget->_vptr_Widget[2])
                      (this->mouse_down_widget,(ulong)(uint)event->x,(ulong)(uint)event->y);
    if ((char)iVar2 != '\0') {
      (*this->mouse_down_widget->_vptr_Widget[9])
                (this->mouse_down_widget,(ulong)(uint)event->x,(ulong)(uint)event->y);
    }
    this->mouse_down_widget = (Widget *)0x0;
  }
  return;
}

Assistant:

void Dialog::on_mouse_button_up(const ALLEGRO_MOUSE_EVENT & event)
{
   if (event.button != 1)
      return;
   if (!this->mouse_down_widget)
      return;

   this->mouse_down_widget->on_mouse_button_up(event.x, event.y);
   if (this->mouse_down_widget->contains(event.x, event.y)) {
      this->mouse_down_widget->on_click(event.x, event.y);
   }
   this->mouse_down_widget = NULL;
}